

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btPoint2PointConstraint.cpp
# Opt level: O3

btScalar __thiscall
btPoint2PointConstraint::getParam(btPoint2PointConstraint *this,int num,int axis)

{
  if (axis == -1) {
    if (num - 3U < 2) {
      return this->m_cfm;
    }
    if (num - 1U < 2) {
      return this->m_erp;
    }
  }
  return 3.4028235e+38;
}

Assistant:

btScalar btPoint2PointConstraint::getParam(int num, int axis) const 
{
	btScalar retVal(SIMD_INFINITY);
	if(axis != -1)
	{
		btAssertConstrParams(0);
	}
	else
	{
		switch(num)
		{
			case BT_CONSTRAINT_ERP :
			case BT_CONSTRAINT_STOP_ERP :
				btAssertConstrParams(m_flags & BT_P2P_FLAGS_ERP);
				retVal = m_erp; 
				break;
			case BT_CONSTRAINT_CFM :
			case BT_CONSTRAINT_STOP_CFM :
				btAssertConstrParams(m_flags & BT_P2P_FLAGS_CFM);
				retVal = m_cfm; 
				break;
			default: 
				btAssertConstrParams(0);
		}
	}
	return retVal;
}